

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O0

void __thiscall klogic::mlmvn::get_stats(mlmvn *this,size_t *n_weights,size_t *n_neurons)

{
  size_t sVar1;
  const_reference this_00;
  size_type sVar2;
  size_t layer_size;
  size_type sStack_28;
  int layer;
  size_t prev_layer_size;
  size_t *n_neurons_local;
  size_t *n_weights_local;
  mlmvn *this_local;
  
  *n_weights = 0;
  *n_neurons = 0;
  layer_size._4_4_ = 0;
  sStack_28 = this->input_size;
  while( true ) {
    sVar1 = layers_count(this);
    if (sVar1 <= (ulong)(long)layer_size._4_4_) break;
    this_00 = std::
              vector<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
              ::operator[](&this->neurons,(long)layer_size._4_4_);
    sVar2 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::size(this_00);
    *n_weights = sVar2 * (sStack_28 + 1) + *n_weights;
    *n_neurons = sVar2 + *n_neurons;
    layer_size._4_4_ = layer_size._4_4_ + 1;
    sStack_28 = sVar2;
  }
  return;
}

Assistant:

void klogic::mlmvn::get_stats(size_t &n_weights, size_t &n_neurons) const
{
    n_weights = 0, n_neurons = 0;

    size_t prev_layer_size = input_size;

    for (int layer = 0; layer < layers_count(); ++layer) {
        size_t layer_size = neurons[layer].size();

        n_weights += layer_size * (prev_layer_size + 1);
        n_neurons += layer_size;

        prev_layer_size = layer_size;
    }
}